

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.h
# Opt level: O0

void round_shift_16bit_ssse3(__m128i *in,int size,int bit)

{
  undefined1 auVar1 [16];
  undefined2 uVar2;
  __m128i alVar3;
  int local_a0;
  int local_9c;
  char local_80;
  int i_1;
  int i;
  __m128i scale;
  int bit_local;
  int size_local;
  __m128i *in_local;
  
  if (bit < 0) {
    local_80 = (char)bit;
    uVar2 = (undefined2)(1 << (local_80 + 0xfU & 0x1f));
    auVar1._2_2_ = uVar2;
    auVar1._0_2_ = uVar2;
    auVar1._4_2_ = uVar2;
    auVar1._6_2_ = uVar2;
    auVar1._10_2_ = uVar2;
    auVar1._8_2_ = uVar2;
    auVar1._12_2_ = uVar2;
    auVar1._14_2_ = uVar2;
    for (local_9c = 0; local_9c < size; local_9c = local_9c + 1) {
      alVar3 = (__m128i)pmulhrsw((undefined1  [16])in[local_9c],auVar1);
      in[local_9c] = alVar3;
    }
  }
  else if (0 < bit) {
    for (local_a0 = 0; local_a0 < size; local_a0 = local_a0 + 1) {
      alVar3 = (__m128i)psllw((undefined1  [16])in[local_a0],ZEXT416((uint)bit));
      in[local_a0] = alVar3;
    }
  }
  return;
}

Assistant:

static inline void round_shift_16bit_ssse3(__m128i *in, int size, int bit) {
  if (bit < 0) {
    const __m128i scale = _mm_set1_epi16(1 << (15 + bit));
    for (int i = 0; i < size; ++i) {
      in[i] = _mm_mulhrs_epi16(in[i], scale);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[i] = _mm_slli_epi16(in[i], bit);
    }
  }
}